

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O2

void __thiscall FfsParser::outputInfo(FfsParser *this)

{
  ostream *poVar1;
  size_t i;
  ulong uVar2;
  long lVar3;
  CBString secInfo;
  vector<std::pair<Bstrlib::CBString,_UModelIndex>,_std::allocator<std::pair<Bstrlib::CBString,_UModelIndex>_>_>
  messages;
  vector<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>,_std::allocator<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>_>_>
  fitTable;
  
  getMessages(&messages,this);
  lVar3 = 0x10;
  for (uVar2 = 0;
      uVar2 < (ulong)(((long)messages.
                             super__Vector_base<std::pair<Bstrlib::CBString,_UModelIndex>,_std::allocator<std::pair<Bstrlib::CBString,_UModelIndex>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)messages.
                            super__Vector_base<std::pair<Bstrlib::CBString,_UModelIndex>,_std::allocator<std::pair<Bstrlib::CBString,_UModelIndex>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x30); uVar2 = uVar2 + 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,
                             *(char **)((long)&((messages.
                                                 super__Vector_base<std::pair<Bstrlib::CBString,_UModelIndex>,_std::allocator<std::pair<Bstrlib::CBString,_UModelIndex>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->first).
                                               _vptr_CBString + lVar3));
    std::endl<char,std::char_traits<char>>(poVar1);
    lVar3 = lVar3 + 0x30;
  }
  fitTable.
  super__Vector_base<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>,_std::allocator<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  fitTable.
  super__Vector_base<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>,_std::allocator<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  fitTable.
  super__Vector_base<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>,_std::allocator<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  getSecurityInfo(&secInfo,this);
  if (secInfo.super_tagbstring.slen != 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "---------------------------------------------------------------------------"
                            );
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"Security Info");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "---------------------------------------------------------------------------"
                            );
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,(char *)secInfo.super_tagbstring.data);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  Bstrlib::CBString::~CBString(&secInfo);
  std::
  vector<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>,_std::allocator<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>_>_>
  ::~vector(&fitTable);
  std::
  vector<std::pair<Bstrlib::CBString,_UModelIndex>,_std::allocator<std::pair<Bstrlib::CBString,_UModelIndex>_>_>
  ::~vector(&messages);
  return;
}

Assistant:

void FfsParser::outputInfo(void) {
    // Show ffsParser's messages
    std::vector<std::pair<UString, UModelIndex> > messages = getMessages();
    for (size_t i = 0; i < messages.size(); i++) {
        std::cout << (const char *)messages[i].first.toLocal8Bit() << std::endl;
    }
    
    // Get last VTF
    std::vector<std::pair<std::vector<UString>, UModelIndex > > fitTable = getFitTable();
    if (fitTable.size()) {
        std::cout << "---------------------------------------------------------------------------" << std::endl;
        std::cout << "     Address      |   Size    |  Ver  | CS  |          Type / Info          " << std::endl;
        std::cout << "---------------------------------------------------------------------------" << std::endl;
        for (size_t i = 0; i < fitTable.size(); i++) {
            std::cout
            << (const char *)fitTable[i].first[0].toLocal8Bit() << " | "
            << (const char *)fitTable[i].first[1].toLocal8Bit() << " | "
            << (const char *)fitTable[i].first[2].toLocal8Bit() << " | "
            << (const char *)fitTable[i].first[3].toLocal8Bit() << " | "
            << (const char *)fitTable[i].first[4].toLocal8Bit() << " | "
            << (const char *)fitTable[i].first[5].toLocal8Bit() << std::endl;
        }
    }
    
    // Get security info
    UString secInfo = getSecurityInfo();
    if (!secInfo.isEmpty()) {
        std::cout << "---------------------------------------------------------------------------"  << std::endl;
        std::cout << "Security Info" << std::endl;
        std::cout << "---------------------------------------------------------------------------"  << std::endl;
        std::cout << (const char *)secInfo.toLocal8Bit() << std::endl;
    }
}